

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

void __thiscall QPlainTextEditPrivate::updateViewport(QPlainTextEditPrivate *this)

{
  QObject *pQVar1;
  QWidgetData *pQVar2;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 local_3c;
  void *local_38;
  undefined8 *puStack_30;
  undefined4 *local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  QWidget::update((this->super_QAbstractScrollAreaPrivate).viewport);
  pQVar2 = ((this->super_QAbstractScrollAreaPrivate).viewport)->data;
  local_48 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                      (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
  puStack_30 = &local_50;
  local_50 = 0;
  local_28 = &local_3c;
  local_3c = 0;
  local_38 = (void *)0x0;
  QMetaObject::activate(pQVar1,&QPlainTextEdit::staticMetaObject,6,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEditPrivate::updateViewport()
{
    Q_Q(QPlainTextEdit);
    viewport->update();
    emit q->updateRequest(viewport->rect(), 0);
}